

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ipc::Deferred<perfetto::protos::gen::GetTraceStatsResponse>::Resolve
          (Deferred<perfetto::protos::gen::GetTraceStatsResponse> *this,
          AsyncResult<perfetto::protos::gen::GetTraceStatsResponse> *async_result)

{
  bool has_more;
  int fd;
  GetTraceStatsResponse *__p;
  AsyncResult<protozero::CppMessageObj> local_50 [2];
  unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_> local_30;
  undefined1 local_28 [8];
  AsyncResult<protozero::CppMessageObj> async_result_base;
  AsyncResult<perfetto::protos::gen::GetTraceStatsResponse> *async_result_local;
  Deferred<perfetto::protos::gen::GetTraceStatsResponse> *this_local;
  
  async_result_base._8_8_ = async_result;
  __p = AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>::release_msg(async_result);
  ::std::unique_ptr<protozero::CppMessageObj,std::default_delete<protozero::CppMessageObj>>::
  unique_ptr<std::default_delete<protozero::CppMessageObj>,void>
            ((unique_ptr<protozero::CppMessageObj,std::default_delete<protozero::CppMessageObj>> *)
             &local_30,&__p->super_CppMessageObj);
  has_more = AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>::has_more(async_result);
  fd = AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>::fd(async_result);
  AsyncResult<protozero::CppMessageObj>::AsyncResult
            ((AsyncResult<protozero::CppMessageObj> *)local_28,&local_30,has_more,fd);
  std::unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>::
  ~unique_ptr(&local_30);
  AsyncResult<protozero::CppMessageObj>::AsyncResult
            (local_50,(AsyncResult<protozero::CppMessageObj> *)local_28);
  DeferredBase::Resolve(&this->super_DeferredBase,local_50);
  AsyncResult<protozero::CppMessageObj>::~AsyncResult(local_50);
  AsyncResult<protozero::CppMessageObj>::~AsyncResult
            ((AsyncResult<protozero::CppMessageObj> *)local_28);
  return;
}

Assistant:

void Resolve(AsyncResult<T> async_result) {
    // Convert the |async_result| to the generic base one (T -> ProtoMessage).
    AsyncResult<ProtoMessage> async_result_base(
        std::unique_ptr<ProtoMessage>(async_result.release_msg()),
        async_result.has_more(), async_result.fd());
    DeferredBase::Resolve(std::move(async_result_base));
  }